

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

FilterMode vk::mapVkMinTexFilter(VkFilter filter,VkSamplerMipmapMode mipMode)

{
  FilterMode FVar1;
  FilterMode FVar2;
  
  if (filter == VK_FILTER_NEAREST) {
    FVar2 = (uint)(mipMode != VK_SAMPLER_MIPMAP_MODE_NEAREST) * 4 + NEAREST_MIPMAP_NEAREST;
    FVar1 = NEAREST_MIPMAP_LINEAR;
  }
  else {
    if (filter != VK_FILTER_LINEAR) {
      return FILTERMODE_LAST;
    }
    FVar2 = (uint)(mipMode != VK_SAMPLER_MIPMAP_MODE_NEAREST) * 2 + LINEAR_MIPMAP_NEAREST;
    FVar1 = LINEAR_MIPMAP_LINEAR;
  }
  if (mipMode != VK_SAMPLER_MIPMAP_MODE_LINEAR) {
    FVar1 = FVar2;
  }
  return FVar1;
}

Assistant:

tcu::Sampler::FilterMode mapVkMinTexFilter (VkFilter filter, VkSamplerMipmapMode mipMode)
{
	switch (filter)
	{
		case VK_FILTER_LINEAR:
			switch (mipMode)
			{
				case VK_SAMPLER_MIPMAP_MODE_LINEAR:		return tcu::Sampler::LINEAR_MIPMAP_LINEAR;
				case VK_SAMPLER_MIPMAP_MODE_NEAREST:	return tcu::Sampler::LINEAR_MIPMAP_NEAREST;
				default:
					break;
			}
			break;

		case VK_FILTER_NEAREST:
			switch (mipMode)
			{
				case VK_SAMPLER_MIPMAP_MODE_LINEAR:		return tcu::Sampler::NEAREST_MIPMAP_LINEAR;
				case VK_SAMPLER_MIPMAP_MODE_NEAREST:	return tcu::Sampler::NEAREST_MIPMAP_NEAREST;
				default:
					break;
			}
			break;

		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::FILTERMODE_LAST;
}